

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_stmt_status(sqlite3_stmt *pStmt,int op,int resetFlag)

{
  int in_EDX;
  int in_ESI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  sqlite3 *db;
  Vdbe *pVdbe;
  u32 v;
  Vdbe *p;
  undefined1 local_c [12];
  
  local_c._4_8_ = *(long *)(in_FS_OFFSET + 0x28);
  local_c._0_4_ = -0x55555556;
  if (in_ESI == 99) {
    p = (Vdbe *)*in_RDI;
    sqlite3_mutex_enter((sqlite3_mutex *)0x141dfb);
    local_c._0_4_ = 0;
    p[2].pResultRow = (Mem *)local_c;
    p[1].startTime = (i64)p[1].pVList;
    sqlite3VdbeDelete(p);
    p[2].pResultRow = (Mem *)0x0;
    p[1].startTime = *(i64 *)&p[1].nResColumn;
    sqlite3_mutex_leave((sqlite3_mutex *)0x141e6c);
  }
  else {
    local_c._0_4_ = *(int *)((long)in_RDI + (long)in_ESI * 4 + 0xd4);
    if (in_EDX != 0) {
      *(undefined4 *)((long)in_RDI + (long)in_ESI * 4 + 0xd4) = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_c._4_8_) {
    __stack_chk_fail();
  }
  return local_c._0_4_;
}

Assistant:

SQLITE_API int sqlite3_stmt_status(sqlite3_stmt *pStmt, int op, int resetFlag){
  Vdbe *pVdbe = (Vdbe*)pStmt;
  u32 v;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !pStmt
   || (op!=SQLITE_STMTSTATUS_MEMUSED && (op<0||op>=ArraySize(pVdbe->aCounter)))
  ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
  if( op==SQLITE_STMTSTATUS_MEMUSED ){
    sqlite3 *db = pVdbe->db;
    sqlite3_mutex_enter(db->mutex);
    v = 0;
    db->pnBytesFreed = (int*)&v;
    assert( db->lookaside.pEnd==db->lookaside.pTrueEnd );
    db->lookaside.pEnd = db->lookaside.pStart;
    sqlite3VdbeDelete(pVdbe);
    db->pnBytesFreed = 0;
    db->lookaside.pEnd = db->lookaside.pTrueEnd;
    sqlite3_mutex_leave(db->mutex);
  }else{
    v = pVdbe->aCounter[op];
    if( resetFlag ) pVdbe->aCounter[op] = 0;
  }
  return (int)v;
}